

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtIthVar(word *pOut,int iVar,int nVars)

{
  int iVar1;
  uint local_1c;
  int nWords;
  int k;
  int nVars_local;
  int iVar_local;
  word *pOut_local;
  
  iVar1 = Abc_TtWordNum(nVars);
  if (iVar < 6) {
    for (local_1c = 0; (int)local_1c < iVar1; local_1c = local_1c + 1) {
      pOut[(int)local_1c] = s_Truths6[iVar];
    }
  }
  else {
    for (local_1c = 0; (int)local_1c < iVar1; local_1c = local_1c + 1) {
      if ((local_1c & 1 << ((char)iVar - 6U & 0x1f)) == 0) {
        pOut[(int)local_1c] = 0;
      }
      else {
        pOut[(int)local_1c] = 0xffffffffffffffff;
      }
    }
  }
  return;
}

Assistant:

static inline void Abc_TtIthVar( word * pOut, int iVar, int nVars )
{
    int k, nWords = Abc_TtWordNum( nVars );
    if ( iVar < 6 )
    {
        for ( k = 0; k < nWords; k++ )
            pOut[k] = s_Truths6[iVar];
    }
    else
    {
        for ( k = 0; k < nWords; k++ )
            if ( k & (1 << (iVar-6)) )
                pOut[k] = ~(word)0;
            else
                pOut[k] = 0;
    }
}